

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_Boolean UA_NodeId_isNull(UA_NodeId *p)

{
  UA_Boolean local_1d;
  UA_NodeId *p_local;
  
  if (p->namespaceIndex == 0) {
    if (p->identifierType == UA_NODEIDTYPE_NUMERIC) {
      p_local._7_1_ = (p->identifier).numeric == 0;
    }
    else if (p->identifierType == UA_NODEIDTYPE_GUID) {
      local_1d = false;
      if (((((((p->identifier).numeric == 0) && (local_1d = false, (p->identifier).guid.data2 == 0))
            && (local_1d = false, (p->identifier).guid.data3 == 0)) &&
           ((local_1d = false, (p->identifier).guid.data4[0] == '\0' &&
            (local_1d = false, (p->identifier).guid.data4[1] == '\0')))) &&
          ((local_1d = false, (p->identifier).guid.data4[2] == '\0' &&
           ((local_1d = false, (p->identifier).guid.data4[3] == '\0' &&
            (local_1d = false, (p->identifier).guid.data4[4] == '\0')))))) &&
         ((local_1d = false, (p->identifier).guid.data4[5] == '\0' &&
          (local_1d = false, (p->identifier).guid.data4[6] == '\0')))) {
        local_1d = (p->identifier).guid.data4[7] == '\0';
      }
      p_local._7_1_ = local_1d;
    }
    else {
      p_local._7_1_ = (p->identifier).string.length == 0;
    }
  }
  else {
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

UA_Boolean
UA_NodeId_isNull(const UA_NodeId *p) {
    if(p->namespaceIndex != 0)
        return false;
    switch(p->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
        return (p->identifier.numeric == 0);
    case UA_NODEIDTYPE_GUID:
        return (p->identifier.guid.data1 == 0 &&
                p->identifier.guid.data2 == 0 &&
                p->identifier.guid.data3 == 0 &&
                p->identifier.guid.data4[0] == 0 &&
                p->identifier.guid.data4[1] == 0 &&
                p->identifier.guid.data4[2] == 0 &&
                p->identifier.guid.data4[3] == 0 &&
                p->identifier.guid.data4[4] == 0 &&
                p->identifier.guid.data4[5] == 0 &&
                p->identifier.guid.data4[6] == 0 &&
                p->identifier.guid.data4[7] == 0);
    default:
        break;
    }
    return (p->identifier.string.length == 0);
}